

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void ecs_enable_system(ecs_world_t *world,ecs_entity_t system,EcsSystem *system_data,_Bool enabled)

{
  ecs_query_t *query;
  int32_t iVar1;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xc6);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xc6,"void ecs_enable_system(ecs_world_t *, ecs_entity_t, EcsSystem *, _Bool)");
  }
  query = system_data->query;
  if (query != (ecs_query_t *)0x0) {
    iVar1 = ecs_vector_count(query->tables);
    if (iVar1 != 0) {
      ecs_system_activate(world,system,enabled,system_data);
      system_data = (EcsSystem *)ecs_get_mut_w_entity(world,system,5,(_Bool *)0x0);
    }
    activate_in_columns(world,query,world->on_enable_components,enabled);
    if (system_data->status_action != (ecs_system_status_action_t)0x0) {
      (*system_data->status_action)
                (world,system,EcsSystemDisabled - enabled,system_data->status_ctx);
      return;
    }
  }
  return;
}

Assistant:

static
void ecs_enable_system(
    ecs_world_t *world,
    ecs_entity_t system,
    EcsSystem *system_data,
    bool enabled)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);

    ecs_query_t *query = system_data->query;
    if (!query) {
        return;
    }

    if (ecs_vector_count(query->tables)) {
        /* Only (de)activate system if it has non-empty tables. */
        ecs_system_activate(world, system, enabled, system_data);
        system_data = ecs_get_mut(world, system, EcsSystem, NULL);
    }

    /* Enable/disable systems that trigger on [in] enablement */
    activate_in_columns(
        world, 
        query, 
        world->on_enable_components, 
        enabled);
    
    /* Invoke action for enable/disable status */
    invoke_status_action(
        world, system, system_data,
        enabled ? EcsSystemEnabled : EcsSystemDisabled);
}